

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  mbedtls_mpi_uint *__dest;
  long lVar4;
  ulong uVar5;
  mbedtls_mpi_uint *__src;
  
  uVar1 = X->n;
  uVar2 = uVar1;
  if (uVar1 <= nblimbs) {
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    return iVar3;
  }
  do {
    uVar5 = uVar2;
    if (uVar5 == 1) break;
    uVar2 = uVar5 - 1;
  } while (X->p[uVar5 - 1] == 0);
  if (nblimbs < uVar5) {
    nblimbs = uVar5;
  }
  __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
  if (__dest == (mbedtls_mpi_uint *)0x0) {
    iVar3 = -0x10;
  }
  else {
    __src = X->p;
    if (__src != (mbedtls_mpi_uint *)0x0) {
      memcpy(__dest,__src,nblimbs * 8);
      if (uVar1 << 3 != 0) {
        lVar4 = 0;
        do {
          *(undefined1 *)((long)__src + lVar4) = 0;
          lVar4 = lVar4 + 1;
        } while (uVar1 << 3 != lVar4);
        __src = X->p;
      }
      free(__src);
    }
    X->n = nblimbs;
    X->p = __dest;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_shrink( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;
    size_t i;

    /* Actually resize up in this case */
    if( X->n <= nblimbs )
        return( mbedtls_mpi_grow( X, nblimbs ) );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;
    i++;

    if( i < nblimbs )
        i = nblimbs;

    if( ( p = mbedtls_calloc( i, ciL ) ) == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->p != NULL )
    {
        memcpy( p, X->p, i * ciL );
        mbedtls_zeroize( X->p, X->n * ciL );
        mbedtls_free( X->p );
    }

    X->n = i;
    X->p = p;

    return( 0 );
}